

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(MultiPartOutputFile *this)

{
  _Base_ptr p_Var1;
  Data *this_00;
  _Self __tmp;
  
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__MultiPartOutputFile_001e3d28;
  this_00 = this->_data;
  for (p_Var1 = (this_00->_outputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this_00->_outputFiles)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
      this_00 = this->_data;
    }
  }
  if (this_00 != (Data *)0x0) {
    Data::~Data(this_00);
  }
  operator_delete(this_00,0xa0);
  GenericOutputFile::~GenericOutputFile(&this->super_GenericOutputFile);
  return;
}

Assistant:

MultiPartOutputFile::~MultiPartOutputFile ()
{
    for (map<int, GenericOutputFile*>::iterator it =
             _data->_outputFiles.begin ();
         it != _data->_outputFiles.end ();
         it++)
    {
        delete it->second;
    }

    delete _data;
}